

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QString>::
appendIteratorRange<QHash<QString,QtInstallDirectoryWithTriple>::key_iterator>
          (QCommonArrayOps<QString> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QString,_QtInstallDirectoryWithTriple>::key_iterator> param_3)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  QString *pQVar4;
  ulong uVar5;
  Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *pDVar6;
  long lVar7;
  
  uVar5 = b.i.i.bucket;
  pDVar6 = b.i.i.d;
  if (uVar5 != e.i.i.bucket || pDVar6 != e.i.i.d) {
    lVar7 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.size
    ;
    pQVar4 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
             + lVar7;
    do {
      pEVar2 = pDVar6->spans[uVar5 >> 7].entries;
      bVar1 = pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f];
      pDVar3 = *(Data **)pEVar2[bVar1].storage.data;
      (pQVar4->d).d = pDVar3;
      (pQVar4->d).ptr = *(char16_t **)(pEVar2[bVar1].storage.data + 8);
      (pQVar4->d).size = *(qsizetype *)(pEVar2[bVar1].storage.data + 0x10);
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar7 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
                size;
      }
      lVar7 = lVar7 + 1;
      (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.size =
           lVar7;
      pQVar4 = pQVar4 + 1;
      do {
        if (pDVar6->numBuckets - 1 == uVar5) {
          pDVar6 = (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while (uVar5 != e.i.i.bucket || pDVar6 != e.i.i.d);
  }
  return;
}

Assistant:

bool operator==(iterator other) const noexcept
    { return d == other.d && bucket == other.bucket; }